

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O1

OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
* __thiscall
kj::
OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
::operator=(OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
            *this,OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                  *other)

{
  byte bVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  if (this->tag != 0) {
    if (this->tag == 1) {
      this->tag = 0;
    }
    if (this->tag == 2) {
      this->tag = 0;
    }
  }
  this->tag = other->tag;
  if (other->tag == 1) {
    *(undefined8 *)((long)&this->field_1 + 0x20) = *(undefined8 *)((long)&other->field_1 + 0x20);
    pvVar2 = (other->field_1).forceAligned;
    uVar3 = *(undefined8 *)((long)&other->field_1 + 8);
    uVar4 = *(undefined8 *)((long)&other->field_1 + 0x18);
    *(undefined8 *)((long)&this->field_1 + 0x10) = *(undefined8 *)((long)&other->field_1 + 0x10);
    *(undefined8 *)((long)&this->field_1 + 0x18) = uVar4;
    (this->field_1).forceAligned = pvVar2;
    *(undefined8 *)((long)&this->field_1 + 8) = uVar3;
    bVar1 = (other->field_1).space[0x28];
    (this->field_1).space[0x28] = bVar1;
    if (bVar1 == '\x01') {
      uVar3 = *(undefined8 *)((long)&other->field_1 + 0x30);
      uVar4 = *(undefined8 *)((long)&other->field_1 + 0x38);
      uVar5 = *(undefined8 *)((long)&other->field_1 + 0x40);
      uVar6 = *(undefined8 *)((long)&other->field_1 + 0x48);
      uVar7 = *(undefined8 *)((long)&other->field_1 + 0x58);
      *(undefined8 *)((long)&this->field_1 + 0x50) = *(undefined8 *)((long)&other->field_1 + 0x50);
      *(undefined8 *)((long)&this->field_1 + 0x58) = uVar7;
      *(undefined8 *)((long)&this->field_1 + 0x40) = uVar5;
      *(undefined8 *)((long)&this->field_1 + 0x48) = uVar6;
      *(undefined8 *)((long)&this->field_1 + 0x30) = uVar3;
      *(undefined8 *)((long)&this->field_1 + 0x38) = uVar4;
    }
  }
  if (other->tag == 2) {
    uVar3 = *(undefined8 *)((long)&other->field_1 + 8);
    (this->field_1).forceAligned = (other->field_1).forceAligned;
    *(undefined8 *)((long)&this->field_1 + 8) = uVar3;
  }
  return this;
}

Assistant:

OneOf& operator=(const OneOf& other) { if (tag != 0) destroy(); copyFrom(other); return *this; }